

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1352d2::StaleFileRemovalCommand::execute
          (StaleFileRemovalCommand *this,BuildSystem *system,TaskInterface ti,
          QueueJobContext *context,ResultFn *resultFn)

{
  FileSystem *pFVar1;
  BuildValue *pBVar2;
  TaskInterface ti_00;
  bool bVar3;
  int iVar4;
  long lVar5;
  BuildSystemImpl *pBVar6;
  int *piVar7;
  char *pcVar8;
  void *pvVar9;
  pointer pbVar10;
  pointer pbVar11;
  long *plVar12;
  bool bVar13;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> values;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  values_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> root;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileToDelete;
  StaleFileRemovalCommand *pSVar14;
  pointer local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  function<void_(llbuild::buildsystem::BuildValue_&&)> *local_170;
  void *local_168;
  void *local_160;
  string *local_158;
  pointer local_150;
  pointer local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  BuildValue local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  pvVar9 = ti.ctx;
  local_168 = ti.impl;
  local_160 = pvVar9;
  if ((this->hasPriorResult == true) && ((this->priorValue).kind == StaleFileRemoval)) {
    local_170 = resultFn;
    computeFilesToDelete(this);
    plVar12 = *(long **)((long)system->impl + 8);
    (**(code **)(*plVar12 + 0x50))(plVar12,this);
    local_150 = (this->filesToDelete).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_158 = &this->pathSeparators;
    pSVar14 = this;
    for (pbVar10 = (this->filesToDelete).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar10 != local_150;
        pbVar10 = pbVar10 + 1) {
      std::__cxx11::string::string((string *)&local_120,(string *)pbVar10);
      pbVar11 = (this->roots).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_198 = (this->roots).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      bVar13 = local_198 == pbVar11;
      this = pSVar14;
      if (bVar13) {
LAB_0014d911:
        for (; local_148 = pbVar10, pbVar10 = local_148, pbVar11 != local_198; pbVar11 = pbVar11 + 1
            ) {
          std::__cxx11::string::string((string *)&local_190,(string *)pbVar11);
          std::__cxx11::string::string((string *)&local_50,(string *)&local_120);
          std::__cxx11::string::string((string *)&local_70,(string *)&local_190);
          bVar3 = llbuild::buildsystem::pathIsPrefixedByPath(&local_50,&local_70);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          bVar13 = (bool)(bVar13 | bVar3);
          std::__cxx11::string::_M_dispose();
          pbVar10 = local_148;
        }
        if (bVar13 == false) {
          plVar12 = *(long **)((long)system->impl + 8);
          std::operator+(&local_140,"Stale file \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_120);
          pcVar8 = "\' is located outside of the allowed root paths.\n";
          goto LAB_0014da9a;
        }
        ti_00.ctx = this;
        ti_00.impl = system;
        pBVar6 = getBuildSystem(ti_00);
        pFVar1 = (pBVar6->fileSystem)._M_t.
                 super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
                 .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl;
        iVar4 = (*pFVar1->_vptr_FileSystem[5])
                          (pFVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_120);
        pSVar14 = this;
        if ((char)iVar4 != '\0') {
          plVar12 = *(long **)((long)system->impl + 8);
          std::operator+(&local_140,"Removed stale file \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_120);
          std::operator+(&local_190,&local_140,"\'\n");
          pvVar9 = (void *)local_190._M_string_length;
          (**(code **)(*plVar12 + 0x60))(plVar12,this,local_190._M_dataplus._M_p);
          std::__cxx11::string::_M_dispose();
          goto LAB_0014dac5;
        }
        piVar7 = __errno_location();
        if (*piVar7 != 2) {
          plVar12 = *(long **)((long)system->impl + 8);
          std::operator+(&local_b0,"cannot remove stale file \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_120);
          std::operator+(&local_90,&local_b0,"\': ");
          pcVar8 = strerror(*piVar7);
          std::operator+(&local_140,&local_90,pcVar8);
          std::operator+(&local_190,&local_140,"\n");
          pvVar9 = (void *)local_190._M_string_length;
          (**(code **)(*plVar12 + 0x68))(plVar12,this,local_190._M_dataplus._M_p);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          goto LAB_0014dac5;
        }
      }
      else {
        lVar5 = std::__cxx11::string::find
                          ((char)local_158,(ulong)(uint)(int)*(char *)local_120._0_8_);
        if (lVar5 != -1) {
          pbVar11 = (pSVar14->roots).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_198 = (pSVar14->roots).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          this = pSVar14;
          goto LAB_0014d911;
        }
        plVar12 = *(long **)((long)system->impl + 8);
        std::operator+(&local_140,"Stale file \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_120);
        pcVar8 = 
        "\' has a relative path. This is invalid in combination with the root path attribute.\n";
        this = pSVar14;
LAB_0014da9a:
        std::operator+(&local_190,&local_140,pcVar8);
        pvVar9 = (void *)local_190._M_string_length;
        pSVar14 = this;
        (**(code **)(*plVar12 + 0x68))(plVar12,this,local_190._M_dataplus._M_p);
        std::__cxx11::string::_M_dispose();
LAB_0014dac5:
        std::__cxx11::string::_M_dispose();
      }
      std::__cxx11::string::_M_dispose();
    }
    plVar12 = *(long **)((long)system->impl + 8);
    (**(code **)(*plVar12 + 0x70))(plVar12,this,0);
    pBVar2 = (BuildValue *)
             (this->expectedOutputs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    values_00.Data =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)(this->expectedOutputs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar2 >> 5);
    values_00.Length = (size_type)pvVar9;
    llbuild::buildsystem::BuildValue::makeStaleFileRemoval(&local_120,pBVar2,values_00);
    resultFn = local_170;
  }
  else {
    plVar12 = *(long **)((long)system->impl + 8);
    (**(code **)(*plVar12 + 0x50))(plVar12,this);
    plVar12 = *(long **)((long)system->impl + 8);
    (**(code **)(*plVar12 + 0x70))(plVar12,this,0);
    pBVar2 = (BuildValue *)
             (this->expectedOutputs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    values.Data = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)(this->expectedOutputs).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar2 >> 5);
    values.Length = (size_type)pvVar9;
    llbuild::buildsystem::BuildValue::makeStaleFileRemoval(&local_120,pBVar2,values);
  }
  std::function<void_(llbuild::buildsystem::BuildValue_&&)>::operator()(resultFn,&local_120);
  llbuild::buildsystem::BuildValue::~BuildValue(&local_120);
  return;
}

Assistant:

virtual void execute(BuildSystem& system,
                       TaskInterface ti,
                       QueueJobContext* context,
                       ResultFn resultFn) override {
    // Nothing to do if we do not have a prior result.
    if (!hasPriorResult || !priorValue.isStaleFileRemoval()) {
      system.getDelegate().commandStarted(this);
      system.getDelegate().commandFinished(this, ProcessStatus::Succeeded);
      resultFn(BuildValue::makeStaleFileRemoval(expectedOutputs));
      return;
    }

    computeFilesToDelete();

    system.getDelegate().commandStarted(this);

    for (auto fileToDelete : filesToDelete) {
      // If no root paths are specified, any path is valid.
      bool isLocatedUnderRootPath = roots.size() == 0 ? true : false;

      // If root paths are defined, stale file paths should be absolute.
      if (roots.size() > 0 &&
          pathSeparators.find(fileToDelete[0]) == std::string::npos) {
        system.getDelegate().commandHadWarning(this, "Stale file '" + fileToDelete + "' has a relative path. This is invalid in combination with the root path attribute.\n");
        continue;
      }

      // Check if the file is located under one of the allowed root paths.
      for (auto root : roots) {
        if (pathIsPrefixedByPath(fileToDelete, root)) {
          isLocatedUnderRootPath = true;
        }
      }

      if (!isLocatedUnderRootPath) {
        system.getDelegate().commandHadWarning(this, "Stale file '" + fileToDelete + "' is located outside of the allowed root paths.\n");
        continue;
      }

      if (getBuildSystem(ti).getFileSystem().remove(fileToDelete)) {
        system.getDelegate().commandHadNote(this, "Removed stale file '" + fileToDelete + "'\n");
      } else {
        // Do not warn if the file has already been deleted.
        if (errno != ENOENT) {
          system.getDelegate().commandHadWarning(this, "cannot remove stale file '" + fileToDelete + "': " + strerror(errno) + "\n");
        }
      }
    }

    system.getDelegate().commandFinished(this, ProcessStatus::Succeeded);

    // Complete with a successful result.
    resultFn(BuildValue::makeStaleFileRemoval(expectedOutputs));
  }